

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCareSet(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pAVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Ntk_t *pAVar4;
  int c;
  char *FileName;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    if (argc == globalUtilOptind + 1) {
      pcVar3 = argv[globalUtilOptind];
      __stream = fopen(pcVar3,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar3);
        pcVar3 = Extra_FileGetSimilarName(pcVar3,".mv",".blif",".pla",".eqn",".bench");
        if (pcVar3 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
        }
        Abc_Print(1,"\n");
        return 1;
      }
      fclose(__stream);
      FileType = Io_ReadFileType(pcVar3);
      pAVar4 = Io_Read(pcVar3,FileType,1,0);
      if (pAVar4 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Reading network from file has failed.\n");
        return 1;
      }
      if (pAVar2->pExcare != (void *)0x0) {
        Abc_NtkDelete((Abc_Ntk_t *)pAVar2->pExcare);
        pAVar2->pExcare = (void *)0x0;
      }
      pAVar2 = Abc_NtkDup(pAVar2);
      pAVar2->pExcare = pAVar4;
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
  }
  Abc_Print(-2,"usage: care_set [-h] <file>\n");
  Abc_Print(-2,"\t         sets the network from file as a care for the current network\n");
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : file with the new care network\n");
  return 1;
}

Assistant:

int Abc_CommandCareSet( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk, * pNtkNew, * pNtkRes;
    char * FileName;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".mv", ".blif", ".pla", ".eqn", ".bench" )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pNtkNew = Io_Read( FileName, Io_ReadFileType(FileName), 1, 0 );
    if ( pNtkNew == NULL )
    {
        Abc_Print( -1, "Reading network from file has failed.\n" );
        return 1;
    }

    // replace the EXDC
    if ( pNtk->pExcare )
    {
        Abc_NtkDelete( (Abc_Ntk_t *)pNtk->pExcare );
        pNtk->pExcare = NULL;
    }
    pNtkRes = Abc_NtkDup( pNtk );
    pNtkRes->pExcare = pNtkNew;

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: care_set [-h] <file>\n" );
    Abc_Print( -2, "\t         sets the network from file as a care for the current network\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file with the new care network\n");
    return 1;
}